

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O2

void test_large_deflate(Byte *compr,uLong comprLen,Byte *uncompr,uLong uncomprLen)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  size_t sStack_a0;
  Byte *local_98;
  uint local_90;
  Byte *local_80;
  uint local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uVar1 = deflateInit_(&local_98,1,"1.2.8",0x70);
  if (uVar1 == 0) {
    local_98 = uncompr;
    local_90 = (uint)uncomprLen;
    local_80 = compr;
    local_78 = (uint)comprLen;
    uVar1 = deflate(&local_98,0);
    if (uVar1 == 0) {
      if (local_90 != 0) {
        pcVar3 = "deflate not greedy\n";
        sStack_a0 = 0x13;
LAB_00102b01:
        fwrite(pcVar3,sStack_a0,1,_stderr);
        goto LAB_00102b2d;
      }
      deflateParams(&local_98,0,0);
      local_90 = (uint)comprLen >> 1;
      local_98 = compr;
      uVar1 = deflate(&local_98,0);
      if (uVar1 == 0) {
        deflateParams(&local_98,9,1);
        local_98 = uncompr;
        local_90 = (uint)uncomprLen;
        uVar1 = deflate(&local_98,0);
        if (uVar1 == 0) {
          iVar2 = deflate(&local_98,4);
          if (iVar2 == 1) {
            uVar1 = deflateEnd(&local_98);
            if (uVar1 == 0) {
              return;
            }
            pcVar3 = "deflateEnd";
            goto LAB_00102b24;
          }
          pcVar3 = "deflate should report Z_STREAM_END\n";
          sStack_a0 = 0x23;
          goto LAB_00102b01;
        }
      }
    }
    pcVar3 = "deflate";
  }
  else {
    pcVar3 = "deflateInit";
  }
LAB_00102b24:
  fprintf(_stderr,"%s error: %d\n",pcVar3,(ulong)uVar1);
LAB_00102b2d:
  exit(1);
}

Assistant:

void test_large_deflate(compr, comprLen, uncompr, uncomprLen)
    Byte *compr, *uncompr;
    uLong comprLen, uncomprLen;
{
    z_stream c_stream; /* compression stream */
    int err;

    c_stream.zalloc = zalloc;
    c_stream.zfree = zfree;
    c_stream.opaque = (voidpf)0;

    err = deflateInit(&c_stream, Z_BEST_SPEED);
    CHECK_ERR(err, "deflateInit");

    c_stream.next_out = compr;
    c_stream.avail_out = (uInt)comprLen;

    /* At this point, uncompr is still mostly zeroes, so it should compress
     * very well:
     */
    c_stream.next_in = uncompr;
    c_stream.avail_in = (uInt)uncomprLen;
    err = deflate(&c_stream, Z_NO_FLUSH);
    CHECK_ERR(err, "deflate");
    if (c_stream.avail_in != 0) {
        fprintf(stderr, "deflate not greedy\n");
        exit(1);
    }

    /* Feed in already compressed data and switch to no compression: */
    deflateParams(&c_stream, Z_NO_COMPRESSION, Z_DEFAULT_STRATEGY);
    c_stream.next_in = compr;
    c_stream.avail_in = (uInt)comprLen/2;
    err = deflate(&c_stream, Z_NO_FLUSH);
    CHECK_ERR(err, "deflate");

    /* Switch back to compressing mode: */
    deflateParams(&c_stream, Z_BEST_COMPRESSION, Z_FILTERED);
    c_stream.next_in = uncompr;
    c_stream.avail_in = (uInt)uncomprLen;
    err = deflate(&c_stream, Z_NO_FLUSH);
    CHECK_ERR(err, "deflate");

    err = deflate(&c_stream, Z_FINISH);
    if (err != Z_STREAM_END) {
        fprintf(stderr, "deflate should report Z_STREAM_END\n");
        exit(1);
    }
    err = deflateEnd(&c_stream);
    CHECK_ERR(err, "deflateEnd");
}